

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

bool __thiscall
CodeGenGenericContext::IsLastRegVmRegisterUse
          (CodeGenGenericContext *this,uchar regId,uchar *instRegKillInfo)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  bool bVar5;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    puVar3 = instRegKillInfo + 1;
    if (0xf < bVar1) {
      puVar3 = instRegKillInfo + (ulong)((bVar1 >> 4) - 1) + 2;
      lVar4 = 0;
      do {
        if ((instRegKillInfo + 1)[lVar4] == regId) {
          return true;
        }
        lVar4 = lVar4 + 1;
      } while ((uint)(bVar1 >> 4) != (uint)lVar4);
    }
    if ((bVar1 & 0xf) != 0) {
      lVar4 = 0;
      do {
        bVar5 = puVar3[lVar4] == regId;
        if (bVar5) {
          return bVar5;
        }
        iVar2 = (int)lVar4;
        lVar4 = lVar4 + 1;
      } while ((bVar1 & 0xf) - 1 != iVar2);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool CodeGenGenericContext::IsLastRegVmRegisterUse(unsigned char regId, unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		for(unsigned k = 0; k < preKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}

		for(unsigned k = 0; k < postKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}
	}

	return false;
}